

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testProcess.c
# Opt level: O0

int test5(int argc,char **argv)

{
  int iVar1;
  char *local_48;
  char *cmd [4];
  int r;
  char **argv_local;
  int argc_local;
  
  local_48 = *argv;
  cmd[0] = "run";
  cmd[1] = "4";
  cmd[2] = (char *)0x0;
  fprintf(_stdout,"Output on stdout before recursive test.\n");
  fprintf(_stderr,"Output on stderr before recursive test.\n");
  fflush(_stdout);
  fflush(_stderr);
  iVar1 = runChild(&local_48,2,1,1,1,1,0,15.0,0,1,0);
  fprintf(_stdout,"Output on stdout after recursive test.\n");
  fprintf(_stderr,"Output on stderr after recursive test.\n");
  fflush(_stdout);
  fflush(_stderr);
  return iVar1;
}

Assistant:

static int test5(int argc, const char* argv[])
{
  int r;
  const char* cmd[4];
  (void)argc;
  cmd[0] = argv[0];
  cmd[1] = "run";
  cmd[2] = "4";
  cmd[3] = 0;
  fprintf(stdout, "Output on stdout before recursive test.\n");
  fprintf(stderr, "Output on stderr before recursive test.\n");
  fflush(stdout);
  fflush(stderr);
  r = runChild(cmd, kwsysProcess_State_Exception,
               kwsysProcess_Exception_Fault, 1, 1, 1, 0, 15, 0, 1, 0);
  fprintf(stdout, "Output on stdout after recursive test.\n");
  fprintf(stderr, "Output on stderr after recursive test.\n");
  fflush(stdout);
  fflush(stderr);
  return r;
}